

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O2

IEventListenerPtr __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory::create
          (TypedListenerFactory *this,IConfig *config)

{
  _func_int **local_20;
  IConfig *local_18;
  
  Detail::make_unique<Catch2ApprovalListener,Catch::IConfig_const*&>((Detail *)&local_20,&local_18);
  (this->super_EventListenerFactory)._vptr_EventListenerFactory = local_20;
  return (IEventListenerPtr)(IEventListener *)this;
}

Assistant:

IEventListenerPtr create( IConfig const* config ) const override {
                return Detail::make_unique<T>( config );
            }